

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O2

Method * google::protobuf::Arena::CreateMaybeMessage<google::protobuf::Method>(Arena *arena)

{
  Method *this;
  
  if (arena == (Arena *)0x0) {
    this = (Method *)operator_new(0x50);
    Method::Method(this);
  }
  else {
    AllocHook(arena,(type_info *)&Method::typeinfo,0x50);
    this = (Method *)AllocateAlignedNoHook(arena,0x50);
    Method::Method(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::Method* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::Method >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::Method >(arena);
}